

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::uniform_matrixfv_invalid_count
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLint location;
  GLfloat *value;
  value_type_conflict2 *__val;
  long lVar1;
  ProgramSources sources;
  ShaderProgram program;
  value_type local_2c0;
  value_type local_2a0;
  undefined1 local_280 [16];
  undefined1 local_270 [104];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  renderCtx = ctx->m_renderCtx;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,
             "#version 300 es\nuniform mediump vec4 vec4_v;\nuniform mediump mat4 mat4_v;\nvoid main (void)\n{\n\tgl_Position = mat4_v * vec4_v;\n}\n"
             ,"");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,
             "#version 300 es\nuniform mediump ivec4 ivec4_f;\nuniform mediump uvec4 uvec4_f;\nuniform sampler2D sampler_f;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor.xy = (vec4(uvec4_f) + vec4(ivec4_f)).xy;\n\tfragColor.zw = texture(sampler_f, vec2(0.0, 0.0)).zw;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_280,0,0xac);
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_270 + 8),&local_2c0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  location = glu::CallLogWrapper::glGetUniformLocation
                       (&ctx->super_CallLogWrapper,local_100.m_program.m_program,"mat4_v");
  NegativeTestContext::expectError(ctx,0);
  if (location == -1) {
    local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
    this = (ostringstream *)(local_280 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"// ERROR: Failed to retrieve uniform location",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_208);
    local_280._0_8_ = (pointer)local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"Failed to retrieve uniform location","");
    NegativeTestContext::fail(ctx,(string *)local_280);
    if ((pointer)local_280._0_8_ != (pointer)local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
    }
  }
  value = (GLfloat *)operator_new(0x80);
  value[0x1c] = 0.0;
  value[0x1d] = 0.0;
  value[0x1e] = 0.0;
  value[0x1f] = 0.0;
  value[0x18] = 0.0;
  value[0x19] = 0.0;
  value[0x1a] = 0.0;
  value[0x1b] = 0.0;
  value[0x14] = 0.0;
  value[0x15] = 0.0;
  value[0x16] = 0.0;
  value[0x17] = 0.0;
  value[0x10] = 0.0;
  value[0x11] = 0.0;
  value[0x12] = 0.0;
  value[0x13] = 0.0;
  value[0xc] = 0.0;
  value[0xd] = 0.0;
  value[0xe] = 0.0;
  value[0xf] = 0.0;
  value[8] = 0.0;
  value[9] = 0.0;
  value[10] = 0.0;
  value[0xb] = 0.0;
  value[4] = 0.0;
  value[5] = 0.0;
  value[6] = 0.0;
  value[7] = 0.0;
  value[0] = 0.0;
  value[1] = 0.0;
  value[2] = 0.0;
  value[3] = 0.0;
  local_280._0_8_ = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "GL_INVALID_OPERATION is generated if count is greater than 1 and the indicated uniform variable is not an array variable."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_280);
  if ((pointer)local_280._0_8_ != (pointer)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  glu::CallLogWrapper::glUniformMatrix2fv(&ctx->super_CallLogWrapper,location,2,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3fv(&ctx->super_CallLogWrapper,location,2,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4fv(&ctx->super_CallLogWrapper,location,2,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix2x3fv(&ctx->super_CallLogWrapper,location,1,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3x2fv(&ctx->super_CallLogWrapper,location,1,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix2x4fv(&ctx->super_CallLogWrapper,location,1,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4x2fv(&ctx->super_CallLogWrapper,location,1,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3x4fv(&ctx->super_CallLogWrapper,location,1,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4x3fv(&ctx->super_CallLogWrapper,location,1,'\0',value);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  operator_delete(value,0x80);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void uniform_matrixfv_invalid_count (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram			(program.getProgram());
	GLint mat4_v			= ctx.glGetUniformLocation(program.getProgram(), "mat4_v"); // mat4
	ctx.expectError(GL_NO_ERROR);

	if (mat4_v == -1)
	{
		ctx.getLog() << TestLog::Message << "// ERROR: Failed to retrieve uniform location" << TestLog::EndMessage;
		ctx.fail("Failed to retrieve uniform location");
	}

	std::vector<GLfloat> data(32);

	ctx.beginSection("GL_INVALID_OPERATION is generated if count is greater than 1 and the indicated uniform variable is not an array variable.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniformMatrix2fv(mat4_v, 2, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3fv(mat4_v, 2, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4fv(mat4_v, 2, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUniformMatrix2x3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix2x4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}